

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkFromPla(char **pPlas,int nInputs,int nOutputs)

{
  uint uVar1;
  Abc_Ntk_t *pNtk;
  char *pcVar2;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  Fxu_Data_t Params;
  
  pNtk = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_SOP,1);
  pcVar2 = Extra_FileNameGeneric("pla");
  pNtk->pName = pcVar2;
  iVar5 = 0;
  if (0 < nInputs) {
    iVar5 = nInputs;
  }
  while (bVar8 = iVar5 != 0, iVar5 = iVar5 + -1, bVar8) {
    Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
  }
  uVar1 = 0;
  uVar6 = 0;
  if (0 < nOutputs) {
    uVar1 = nOutputs;
    uVar6 = nOutputs;
  }
  while (uVar1 != 0) {
    Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
    uVar1 = uVar1 - 1;
  }
  Abc_NtkAddDummyPiNames(pNtk);
  Abc_NtkAddDummyPoNames(pNtk);
  uVar7 = 0;
  do {
    if (uVar7 == uVar6) {
      iVar5 = Abc_NtkCheck(pNtk);
      if (iVar5 == 0) {
        fwrite("Abc_NtkFromPla(): Network check has failed.\n",0x2c,1,_stdout);
      }
      Abc_NtkSetDefaultFxParams(&Params);
      Abc_NtkFastExtract(pNtk,&Params);
      Abc_NtkFxuFreeInfo(&Params);
      pAVar4 = Abc_NtkStrash(pNtk,0,1,0);
      Abc_NtkDelete(pNtk);
      return pAVar4;
    }
    pFanin = Abc_NtkCreateNode(pNtk);
    for (iVar5 = 0; iVar5 < pNtk->vPis->nSize; iVar5 = iVar5 + 1) {
      pAVar3 = Abc_NtkPi(pNtk,iVar5);
      Abc_ObjAddFanin(pFanin,pAVar3);
    }
    pcVar2 = Abc_SopRegister((Mem_Flex_t *)pNtk->pManFunc,pPlas[uVar7]);
    (pFanin->field_5).pData = pcVar2;
    pAVar3 = Abc_NtkPo(pNtk,(int)uVar7);
    Abc_ObjAddFanin(pAVar3,pFanin);
    iVar5 = Abc_SopGetVarNum((char *)(pFanin->field_5).pData);
    uVar7 = uVar7 + 1;
  } while (iVar5 == nInputs);
  __assert_fail("Abc_SopGetVarNum((char*)pNode->pData) == nInputs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                ,0xac2,"Abc_Ntk_t *Abc_NtkFromPla(char **, int, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkFromPla( char ** pPlas, int nInputs, int nOutputs )
{
    Fxu_Data_t Params, * p = &Params;
    Abc_Ntk_t * pNtkSop, * pNtkAig; 
    Abc_Obj_t * pNode, * pFanin;
    int i, k;
    // allocate logic network with SOP local functions
    pNtkSop = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_SOP, 1 );
    pNtkSop->pName = Extra_FileNameGeneric("pla");
    // create primary inputs/outputs
    for ( i = 0; i < nInputs; i++ )
        Abc_NtkCreatePi( pNtkSop );
    for ( i = 0; i < nOutputs; i++ )
        Abc_NtkCreatePo( pNtkSop );
    Abc_NtkAddDummyPiNames( pNtkSop );
    Abc_NtkAddDummyPoNames( pNtkSop );
    // create internal nodes
    for ( i = 0; i < nOutputs; i++ )
    {
        pNode = Abc_NtkCreateNode( pNtkSop );
        Abc_NtkForEachPi( pNtkSop, pFanin, k )
            Abc_ObjAddFanin( pNode, pFanin );
        pNode->pData = Abc_SopRegister( (Mem_Flex_t *)pNtkSop->pManFunc, pPlas[i] );
        Abc_ObjAddFanin( Abc_NtkPo(pNtkSop, i), pNode );
        // check that the number of inputs is the same
        assert( Abc_SopGetVarNum((char*)pNode->pData) == nInputs );
    }
    if ( !Abc_NtkCheck( pNtkSop ) )
        fprintf( stdout, "Abc_NtkFromPla(): Network check has failed.\n" );
    // perform fast_extract
    Abc_NtkSetDefaultFxParams( p );
    Abc_NtkFastExtract( pNtkSop, p );
    Abc_NtkFxuFreeInfo( p );
    // convert to an AIG
    pNtkAig = Abc_NtkStrash( pNtkSop, 0, 1, 0 );
    Abc_NtkDelete( pNtkSop );
    return pNtkAig;
}